

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::get_token_string(string *__return_storage_ptr__,
                  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *this)

{
  byte *pbVar1;
  byte *pbVar2;
  array<char,_9UL> cs;
  char local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar2 = (byte *)(this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  pbVar1 = (byte *)(this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    do {
      if (*pbVar2 < 0x20) {
        local_40[8] = 0;
        local_40[0] = '\0';
        local_40[1] = '\0';
        local_40[2] = '\0';
        local_40[3] = '\0';
        local_40[4] = '\0';
        local_40[5] = '\0';
        local_40[6] = '\0';
        local_40[7] = '\0';
        snprintf(local_40,9,"<U+%.4X>");
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_token_string() const
    {
        // escape control characters
        std::string result;
        for (const auto c : token_string)
        {
            if (static_cast<unsigned char>(c) <= '\x1F')
            {
                // escape control characters
                std::array<char, 9> cs{{}};
                (std::snprintf)(cs.data(), cs.size(), "<U+%.4X>", static_cast<unsigned char>(c));
                result += cs.data();
            }
            else
            {
                // add character as is
                result.push_back(static_cast<std::string::value_type>(c));
            }
        }

        return result;
    }